

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.h
# Opt level: O0

void __thiscall google::CapturedStream::Capture(CapturedStream *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *__file;
  ostream *poVar4;
  LogMessage local_230;
  LogMessageVoidify local_1ca;
  byte local_1c9;
  LogMessage local_1c8;
  LogMessageVoidify local_162;
  byte local_161;
  LogMessage local_160;
  LogMessageVoidify local_f9;
  FileDescriptor local_f8;
  byte local_f1;
  FileDescriptor cap_fd;
  LogMessageVoidify local_8d [20];
  byte local_79;
  LogMessage local_78;
  LogMessageVoidify local_11;
  CapturedStream *local_10;
  CapturedStream *this_local;
  
  local_10 = this;
  bVar1 = glog_internal_namespace_::FileDescriptor::operator_cast_to_bool(&this->uncaptured_fd_);
  local_79 = 0;
  if (bVar1) {
    LogMessageVoidify::LogMessageVoidify(&local_11);
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_78,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/googletest.h"
               ,0x136);
    local_79 = 1;
    poVar4 = LogMessage::stream(&local_78);
    poVar4 = std::operator<<(poVar4,"Check failed: !uncaptured_fd_ ");
    poVar4 = std::operator<<(poVar4,", Stream ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->fd_);
    poVar4 = std::operator<<(poVar4," already captured!");
    LogMessageVoidify::operator&(&local_11,poVar4);
  }
  if ((local_79 & 1) != 0) {
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_78);
  }
  iVar2 = dup(this->fd_);
  glog_internal_namespace_::FileDescriptor::reset(&this->uncaptured_fd_,iVar2);
  bVar1 = glog_internal_namespace_::FileDescriptor::operator_cast_to_bool(&this->uncaptured_fd_);
  local_f1 = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    LogMessageVoidify::LogMessageVoidify(local_8d);
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&cap_fd,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/googletest.h"
               ,0x138);
    local_f1 = 1;
    poVar4 = LogMessage::stream((LogMessage *)&cap_fd);
    poVar4 = std::operator<<(poVar4,"Check failed: uncaptured_fd_ ");
    LogMessageVoidify::operator&(local_8d,poVar4);
  }
  if ((local_f1 & 1) != 0) {
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&cap_fd);
  }
  __file = (char *)std::__cxx11::string::c_str();
  iVar2 = open(__file,0x241,0x180);
  glog_internal_namespace_::FileDescriptor::FileDescriptor(&local_f8,iVar2);
  bVar1 = glog_internal_namespace_::FileDescriptor::operator_cast_to_bool(&local_f8);
  local_161 = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    LogMessageVoidify::LogMessageVoidify(&local_f9);
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_160,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/googletest.h"
               ,0x13d);
    local_161 = 1;
    poVar4 = LogMessage::stream(&local_160);
    poVar4 = std::operator<<(poVar4,"Check failed: cap_fd ");
    LogMessageVoidify::operator&(&local_f9,poVar4);
  }
  if ((local_161 & 1) != 0) {
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_160);
  }
  fflush((FILE *)0x0);
  iVar3 = glog_internal_namespace_::FileDescriptor::get(&local_f8);
  iVar2 = this->fd_;
  iVar3 = dup2(iVar3,iVar2);
  local_1c9 = 0;
  if (iVar3 == -1) {
    LogMessageVoidify::LogMessageVoidify(&local_162);
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1c8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/googletest.h"
               ,0x141);
    local_1c9 = 1;
    poVar4 = LogMessage::stream(&local_1c8);
    poVar4 = std::operator<<(poVar4,"Check failed: dup2(cap_fd.get(), fd_) != -1 ");
    LogMessageVoidify::operator&(&local_162,poVar4);
    iVar2 = (int)poVar4;
  }
  if ((local_1c9 & 1) != 0) {
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1c8);
  }
  iVar2 = glog_internal_namespace_::FileDescriptor::close(&local_f8,iVar2);
  if (iVar2 == -1) {
    LogMessageVoidify::LogMessageVoidify(&local_1ca);
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_230,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/googletest.h"
               ,0x142);
    poVar4 = LogMessage::stream(&local_230);
    poVar4 = std::operator<<(poVar4,"Check failed: cap_fd.close() != -1 ");
    LogMessageVoidify::operator&(&local_1ca,poVar4);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_230);
  }
  glog_internal_namespace_::FileDescriptor::~FileDescriptor(&local_f8);
  return;
}

Assistant:

void Capture() {
    // Keep original stream for later
    CHECK(!uncaptured_fd_) << ", Stream " << fd_ << " already captured!";
    uncaptured_fd_.reset(dup(fd_));
    CHECK(uncaptured_fd_);

    // Open file to save stream to
    FileDescriptor cap_fd{open(filename_.c_str(), O_CREAT | O_TRUNC | O_WRONLY,
                               S_IRUSR | S_IWUSR)};
    CHECK(cap_fd);

    // Send stdout/stderr to this file
    fflush(nullptr);
    CHECK(dup2(cap_fd.get(), fd_) != -1);
    CHECK(cap_fd.close() != -1);
  }